

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O2

void __thiscall AMinotaur::Tick(AMinotaur *this)

{
  uint uVar1;
  
  AActor::Tick(&this->super_AActor);
  if ((((this->super_AActor).flags5.Value & 0x2000000) == 0) &&
     (uVar1 = (this->super_AActor).flags2.Value,
     (((this->super_AActor).flags.Value << 3 ^ uVar1) >> 0x1b & 1) != 0)) {
    (this->super_AActor).flags2.Value = uVar1 ^ 0x8000000;
  }
  return;
}

Assistant:

void AMinotaur::Tick ()
{
	Super::Tick ();
	
	// The unfriendly Minotaur (Heretic's) is invulnerable while charging
	if (!(flags5 & MF5_SUMMONEDMONSTER))
	{
		// Get MF_SKULLFLY bit and shift it so it matches MF2_INVULNERABLE
		DWORD flying = (flags & MF_SKULLFLY) << 3;
		if ((flags2 & MF2_INVULNERABLE) != flying)
		{
			flags2 ^= MF2_INVULNERABLE;
		}
	}
}